

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O1

int Abc_TgSymGroupPerm(Abc_TgMan_t *pMan,int idx,int fSwapOnly)

{
  int iVar1;
  word wVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  long lVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  word *pLimit;
  word *pLimit_1;
  word *pwVar17;
  ulong uVar18;
  ulong *puVar19;
  ulong uVar20;
  word *pwVar21;
  Abc_TgMan_t tgManCopy;
  int local_1f0;
  Abc_TgMan_t local_1b8;
  word *local_f8;
  int *local_f0;
  undefined1 local_e4 [180];
  
  local_f8 = pMan->pTruth;
  uVar11 = 1 << ((char)pMan->nVars - 6U & 0x1f);
  if (pMan->nVars < 7) {
    uVar11 = 1;
  }
  CheckConfig(pMan);
  memcpy(&local_1b8,pMan,0xc0);
  iVar1 = pMan->nVars;
  uVar16 = 1 << ((char)iVar1 - 6U & 0x1f);
  if (iVar1 < 7) {
    uVar16 = 1;
  }
  uVar20 = (ulong)uVar16;
  pwVar21 = pMan->pTruth;
  uVar13 = (ulong)uVar11;
  if (fSwapOnly == 0) {
    if (0 < (int)uVar16) {
      lVar9 = 0;
      do {
        *(undefined8 *)((long)Abc_TgSymGroupPerm::pCopy + lVar9) =
             *(undefined8 *)((long)pwVar21 + lVar9);
        lVar9 = lVar9 + 8;
      } while (uVar20 << 3 != lVar9);
    }
    local_1b8.pTruth = Abc_TgSymGroupPerm::pCopy;
    local_f0 = &pMan->nGVars;
    memcpy(local_e4,local_f0,0xb4);
    if (0 < (int)uVar16) {
      lVar9 = 0;
      do {
        *(undefined8 *)((long)Abc_TgSymGroupPerm::pBest + lVar9) =
             *(undefined8 *)((long)pwVar21 + lVar9);
        lVar9 = lVar9 + 8;
      } while (uVar20 << 3 != lVar9);
    }
    bVar10 = local_1b8.pPerm[idx];
    if (-1 < (char)bVar10) {
      iVar8 = local_1b8.nVars + -6;
      uVar15 = 1 << ((byte)iVar8 & 0x1f);
      uVar16 = local_1b8.uPhase;
      do {
        if (local_1b8.symPhase[bVar10] != '\0') {
          bVar6 = local_1b8.pPermTRev[bVar10];
          uVar12 = (uint)(char)bVar6;
          if (local_1b8.nVars < 7) {
            bVar6 = (byte)(1 << (bVar6 & 0x1f));
            Abc_TgSymGroupPerm::pCopy[0] =
                 (s_Truths6[(int)uVar12] & Abc_TgSymGroupPerm::pCopy[0]) >> (bVar6 & 0x3f) |
                 Abc_TgSymGroupPerm::pCopy[0] << (bVar6 & 0x3f) & s_Truths6[(int)uVar12];
          }
          else if ((char)bVar6 < '\x06') {
            if (iVar8 != 0x1f) {
              uVar20 = s_Truths6[(int)uVar12];
              pwVar21 = Abc_TgSymGroupPerm::pCopy;
              uVar18 = (ulong)uVar15;
              do {
                bVar7 = (byte)(1 << (bVar6 & 0x1f));
                *pwVar21 = (*pwVar21 & uVar20) >> (bVar7 & 0x3f) |
                           *pwVar21 << (bVar7 & 0x3f) & uVar20;
                pwVar21 = pwVar21 + 1;
                uVar18 = uVar18 - 1;
              } while (uVar18 != 0);
            }
          }
          else if (iVar8 != 0x1f) {
            bVar6 = (byte)(uVar12 - 6);
            uVar5 = 1 << (bVar6 & 0x1f);
            iVar14 = 2 << (bVar6 & 0x1f);
            uVar20 = 1;
            if (1 < (int)uVar5) {
              uVar20 = (ulong)uVar5;
            }
            pwVar21 = Abc_TgSymGroupPerm::pCopy + (int)uVar5;
            pwVar17 = Abc_TgSymGroupPerm::pCopy;
            do {
              if (uVar12 - 6 != 0x1f) {
                uVar18 = 0;
                do {
                  wVar2 = pwVar17[uVar18];
                  pwVar17[uVar18] = pwVar21[uVar18];
                  pwVar21[uVar18] = wVar2;
                  uVar18 = uVar18 + 1;
                } while (uVar20 != uVar18);
              }
              pwVar17 = pwVar17 + iVar14;
              pwVar21 = pwVar21 + iVar14;
            } while (pwVar17 < Abc_TgSymGroupPerm::pCopy + (int)uVar15);
          }
          uVar16 = uVar16 ^ 1 << (uVar12 & 0x1f);
          local_1b8.uPhase = uVar16;
        }
        bVar10 = local_1b8.symLink[bVar10];
      } while (-1 < (char)bVar10);
    }
    CheckConfig(&local_1b8);
    iVar8 = local_1b8.nVars;
    local_1f0 = 0;
    uVar20 = uVar13;
    do {
      if ((int)uVar20 < 1) goto LAB_004fd509;
      lVar9 = uVar20 + 0x3ff;
      lVar4 = uVar20 + 0x3ff;
      uVar20 = uVar20 - 1;
    } while (Abc_TgSymGroupPerm::pCopy[lVar4] == Abc_TgPermEnumerationScc::pCopy[lVar9]);
    if (Abc_TgPermEnumerationScc::pCopy[lVar9] <= Abc_TgSymGroupPerm::pCopy[lVar4]) {
      memcpy(local_e4,&local_1b8.nGVars,0xb4);
      local_1f0 = 1;
      uVar16 = 1 << ((char)iVar8 - 6U & 0x1f);
      if (iVar8 < 7) {
        uVar16 = 1;
      }
      iVar1 = iVar8;
      if (0 < (int)uVar16) {
        lVar9 = 0;
        do {
          *(undefined8 *)((long)Abc_TgSymGroupPerm::pBest + lVar9) =
               *(undefined8 *)((long)local_1b8.pTruth + lVar9);
          lVar9 = lVar9 + 8;
        } while ((ulong)uVar16 << 3 != lVar9);
      }
    }
LAB_004fd509:
    bVar10 = local_1b8.pPerm[(long)idx + 1];
    if (-1 < (char)bVar10) {
      iVar8 = local_1b8.nVars + -6;
      uVar15 = 1 << ((byte)iVar8 & 0x1f);
      uVar16 = local_1b8.uPhase;
      do {
        if (local_1b8.symPhase[bVar10] != '\0') {
          bVar6 = local_1b8.pPermTRev[bVar10];
          uVar12 = (uint)(char)bVar6;
          if (local_1b8.nVars < 7) {
            bVar6 = (byte)(1 << (bVar6 & 0x1f));
            *local_1b8.pTruth =
                 (s_Truths6[(int)uVar12] & *local_1b8.pTruth) >> (bVar6 & 0x3f) |
                 *local_1b8.pTruth << (bVar6 & 0x3f) & s_Truths6[(int)uVar12];
          }
          else if ((char)bVar6 < '\x06') {
            if (iVar8 != 0x1f) {
              uVar20 = s_Truths6[(int)uVar12];
              uVar18 = 0;
              do {
                bVar7 = (byte)(1 << (bVar6 & 0x1f));
                local_1b8.pTruth[uVar18] =
                     (local_1b8.pTruth[uVar18] & uVar20) >> (bVar7 & 0x3f) |
                     local_1b8.pTruth[uVar18] << (bVar7 & 0x3f) & uVar20;
                uVar18 = uVar18 + 1;
              } while (uVar15 != uVar18);
            }
          }
          else if (iVar8 != 0x1f) {
            bVar6 = (byte)(uVar12 - 6);
            uVar5 = 1 << (bVar6 & 0x1f);
            iVar14 = 2 << (bVar6 & 0x1f);
            uVar20 = 1;
            if (1 < (int)uVar5) {
              uVar20 = (ulong)uVar5;
            }
            puVar19 = local_1b8.pTruth + (int)uVar5;
            pwVar21 = local_1b8.pTruth;
            do {
              if (uVar12 - 6 != 0x1f) {
                uVar18 = 0;
                do {
                  uVar3 = pwVar21[uVar18];
                  pwVar21[uVar18] = puVar19[uVar18];
                  puVar19[uVar18] = uVar3;
                  uVar18 = uVar18 + 1;
                } while (uVar20 != uVar18);
              }
              pwVar21 = pwVar21 + iVar14;
              puVar19 = puVar19 + iVar14;
            } while (pwVar21 < local_1b8.pTruth + (int)uVar15);
          }
          uVar16 = uVar16 ^ 1 << (uVar12 & 0x1f);
          local_1b8.uPhase = uVar16;
        }
        bVar10 = local_1b8.symLink[bVar10];
      } while (-1 < (char)bVar10);
    }
    CheckConfig(&local_1b8);
    iVar8 = local_1b8.nVars;
    uVar20 = uVar13;
    do {
      if ((int)uVar20 < 1) goto LAB_004fd700;
      lVar9 = uVar20 + 0x3ff;
      lVar4 = uVar20 + 0x3ff;
      uVar20 = uVar20 - 1;
    } while (Abc_TgSymGroupPerm::pCopy[lVar4] == Abc_TgPermEnumerationScc::pCopy[lVar9]);
    if (Abc_TgPermEnumerationScc::pCopy[lVar9] <= Abc_TgSymGroupPerm::pCopy[lVar4]) {
      memcpy(local_e4,&local_1b8.nGVars,0xb4);
      uVar16 = 1 << ((char)iVar8 - 6U & 0x1f);
      if (iVar8 < 7) {
        uVar16 = 1;
      }
      local_1f0 = 3;
      iVar1 = iVar8;
      if (0 < (int)uVar16) {
        lVar9 = 0;
        do {
          *(undefined8 *)((long)Abc_TgSymGroupPerm::pBest + lVar9) =
               *(undefined8 *)((long)local_1b8.pTruth + lVar9);
          lVar9 = lVar9 + 8;
        } while ((ulong)uVar16 << 3 != lVar9);
      }
    }
LAB_004fd700:
    bVar10 = local_1b8.pPerm[idx];
    if (-1 < (char)bVar10) {
      iVar8 = local_1b8.nVars + -6;
      uVar15 = 1 << ((byte)iVar8 & 0x1f);
      uVar16 = local_1b8.uPhase;
      do {
        if (local_1b8.symPhase[bVar10] != '\0') {
          bVar6 = local_1b8.pPermTRev[bVar10];
          uVar12 = (uint)(char)bVar6;
          if (local_1b8.nVars < 7) {
            bVar6 = (byte)(1 << (bVar6 & 0x1f));
            *local_1b8.pTruth =
                 (s_Truths6[(int)uVar12] & *local_1b8.pTruth) >> (bVar6 & 0x3f) |
                 *local_1b8.pTruth << (bVar6 & 0x3f) & s_Truths6[(int)uVar12];
          }
          else if ((char)bVar6 < '\x06') {
            if (iVar8 != 0x1f) {
              uVar20 = s_Truths6[(int)uVar12];
              uVar18 = 0;
              do {
                bVar7 = (byte)(1 << (bVar6 & 0x1f));
                local_1b8.pTruth[uVar18] =
                     (local_1b8.pTruth[uVar18] & uVar20) >> (bVar7 & 0x3f) |
                     local_1b8.pTruth[uVar18] << (bVar7 & 0x3f) & uVar20;
                uVar18 = uVar18 + 1;
              } while (uVar15 != uVar18);
            }
          }
          else if (iVar8 != 0x1f) {
            bVar6 = (byte)(uVar12 - 6);
            uVar5 = 1 << (bVar6 & 0x1f);
            iVar14 = 2 << (bVar6 & 0x1f);
            uVar20 = 1;
            if (1 < (int)uVar5) {
              uVar20 = (ulong)uVar5;
            }
            puVar19 = local_1b8.pTruth + (int)uVar5;
            pwVar21 = local_1b8.pTruth;
            do {
              if (uVar12 - 6 != 0x1f) {
                uVar18 = 0;
                do {
                  uVar3 = pwVar21[uVar18];
                  pwVar21[uVar18] = puVar19[uVar18];
                  puVar19[uVar18] = uVar3;
                  uVar18 = uVar18 + 1;
                } while (uVar20 != uVar18);
              }
              pwVar21 = pwVar21 + iVar14;
              puVar19 = puVar19 + iVar14;
            } while (pwVar21 < local_1b8.pTruth + (int)uVar15);
          }
          uVar16 = uVar16 ^ 1 << (uVar12 & 0x1f);
          local_1b8.uPhase = uVar16;
        }
        bVar10 = local_1b8.symLink[bVar10];
      } while (-1 < (char)bVar10);
    }
    CheckConfig(&local_1b8);
    iVar8 = local_1b8.nVars;
    uVar20 = uVar13;
    do {
      if ((int)uVar20 < 1) goto LAB_004fd8f0;
      lVar9 = uVar20 + 0x3ff;
      lVar4 = uVar20 + 0x3ff;
      uVar20 = uVar20 - 1;
    } while (Abc_TgSymGroupPerm::pCopy[lVar4] == Abc_TgPermEnumerationScc::pCopy[lVar9]);
    if (Abc_TgPermEnumerationScc::pCopy[lVar9] <= Abc_TgSymGroupPerm::pCopy[lVar4]) {
      memcpy(local_e4,&local_1b8.nGVars,0xb4);
      uVar16 = 1 << ((char)iVar8 - 6U & 0x1f);
      if (iVar8 < 7) {
        uVar16 = 1;
      }
      iVar1 = iVar8;
      if ((int)uVar16 < 1) {
        local_1f0 = 2;
      }
      else {
        local_1f0 = 2;
        lVar9 = 0;
        do {
          *(undefined8 *)((long)Abc_TgSymGroupPerm::pBest + lVar9) =
               *(undefined8 *)((long)local_1b8.pTruth + lVar9);
          lVar9 = lVar9 + 8;
        } while ((ulong)uVar16 << 3 != lVar9);
      }
    }
LAB_004fd8f0:
    Abc_TgSwapAdjacentSymGroups(&local_1b8,idx);
    CheckConfig(&local_1b8);
    iVar8 = local_1b8.nVars;
    uVar20 = uVar13;
    do {
      if ((int)uVar20 < 1) goto LAB_004fd99b;
      lVar9 = uVar20 + 0x3ff;
      lVar4 = uVar20 + 0x3ff;
      uVar20 = uVar20 - 1;
    } while (Abc_TgSymGroupPerm::pCopy[lVar4] == Abc_TgPermEnumerationScc::pCopy[lVar9]);
    if (Abc_TgPermEnumerationScc::pCopy[lVar9] <= Abc_TgSymGroupPerm::pCopy[lVar4]) {
      memcpy(local_e4,&local_1b8.nGVars,0xb4);
      uVar16 = 1 << ((char)iVar8 - 6U & 0x1f);
      if (iVar8 < 7) {
        uVar16 = 1;
      }
      iVar1 = iVar8;
      if ((int)uVar16 < 1) {
        local_1f0 = 6;
      }
      else {
        local_1f0 = 6;
        lVar9 = 0;
        do {
          *(undefined8 *)((long)Abc_TgSymGroupPerm::pBest + lVar9) =
               *(undefined8 *)((long)local_1b8.pTruth + lVar9);
          lVar9 = lVar9 + 8;
        } while ((ulong)uVar16 << 3 != lVar9);
      }
    }
LAB_004fd99b:
    bVar10 = local_1b8.pPerm[(long)idx + 1];
    if (-1 < (char)bVar10) {
      iVar8 = local_1b8.nVars + -6;
      uVar15 = 1 << ((byte)iVar8 & 0x1f);
      uVar16 = local_1b8.uPhase;
      do {
        if (local_1b8.symPhase[bVar10] != '\0') {
          bVar6 = local_1b8.pPermTRev[bVar10];
          uVar12 = (uint)(char)bVar6;
          if (local_1b8.nVars < 7) {
            bVar6 = (byte)(1 << (bVar6 & 0x1f));
            *local_1b8.pTruth =
                 (s_Truths6[(int)uVar12] & *local_1b8.pTruth) >> (bVar6 & 0x3f) |
                 *local_1b8.pTruth << (bVar6 & 0x3f) & s_Truths6[(int)uVar12];
          }
          else if ((char)bVar6 < '\x06') {
            if (iVar8 != 0x1f) {
              uVar20 = s_Truths6[(int)uVar12];
              uVar18 = 0;
              do {
                bVar7 = (byte)(1 << (bVar6 & 0x1f));
                local_1b8.pTruth[uVar18] =
                     (local_1b8.pTruth[uVar18] & uVar20) >> (bVar7 & 0x3f) |
                     local_1b8.pTruth[uVar18] << (bVar7 & 0x3f) & uVar20;
                uVar18 = uVar18 + 1;
              } while (uVar15 != uVar18);
            }
          }
          else if (iVar8 != 0x1f) {
            bVar6 = (byte)(uVar12 - 6);
            uVar5 = 1 << (bVar6 & 0x1f);
            iVar14 = 2 << (bVar6 & 0x1f);
            uVar20 = 1;
            if (1 < (int)uVar5) {
              uVar20 = (ulong)uVar5;
            }
            puVar19 = local_1b8.pTruth + (int)uVar5;
            pwVar21 = local_1b8.pTruth;
            do {
              if (uVar12 - 6 != 0x1f) {
                uVar18 = 0;
                do {
                  uVar3 = pwVar21[uVar18];
                  pwVar21[uVar18] = puVar19[uVar18];
                  puVar19[uVar18] = uVar3;
                  uVar18 = uVar18 + 1;
                } while (uVar20 != uVar18);
              }
              pwVar21 = pwVar21 + iVar14;
              puVar19 = puVar19 + iVar14;
            } while (pwVar21 < local_1b8.pTruth + (int)uVar15);
          }
          uVar16 = uVar16 ^ 1 << (uVar12 & 0x1f);
          local_1b8.uPhase = uVar16;
        }
        bVar10 = local_1b8.symLink[bVar10];
      } while (-1 < (char)bVar10);
    }
    CheckConfig(&local_1b8);
    iVar8 = local_1b8.nVars;
    uVar20 = uVar13;
    do {
      if ((int)uVar20 < 1) goto LAB_004fdb7e;
      lVar9 = uVar20 + 0x3ff;
      lVar4 = uVar20 + 0x3ff;
      uVar20 = uVar20 - 1;
    } while (Abc_TgSymGroupPerm::pCopy[lVar4] == Abc_TgPermEnumerationScc::pCopy[lVar9]);
    if (Abc_TgPermEnumerationScc::pCopy[lVar9] <= Abc_TgSymGroupPerm::pCopy[lVar4]) {
      memcpy(local_e4,&local_1b8.nGVars,0xb4);
      uVar16 = 1 << ((char)iVar8 - 6U & 0x1f);
      if (iVar8 < 7) {
        uVar16 = 1;
      }
      local_1f0 = 7;
      iVar1 = iVar8;
      if (0 < (int)uVar16) {
        lVar9 = 0;
        do {
          *(undefined8 *)((long)Abc_TgSymGroupPerm::pBest + lVar9) =
               *(undefined8 *)((long)local_1b8.pTruth + lVar9);
          lVar9 = lVar9 + 8;
        } while ((ulong)uVar16 << 3 != lVar9);
      }
    }
LAB_004fdb7e:
    bVar10 = local_1b8.pPerm[idx];
    if (-1 < (char)bVar10) {
      iVar8 = local_1b8.nVars + -6;
      uVar15 = 1 << ((byte)iVar8 & 0x1f);
      uVar16 = local_1b8.uPhase;
      do {
        if (local_1b8.symPhase[bVar10] != '\0') {
          bVar6 = local_1b8.pPermTRev[bVar10];
          uVar12 = (uint)(char)bVar6;
          if (local_1b8.nVars < 7) {
            bVar6 = (byte)(1 << (bVar6 & 0x1f));
            *local_1b8.pTruth =
                 (s_Truths6[(int)uVar12] & *local_1b8.pTruth) >> (bVar6 & 0x3f) |
                 *local_1b8.pTruth << (bVar6 & 0x3f) & s_Truths6[(int)uVar12];
          }
          else if ((char)bVar6 < '\x06') {
            if (iVar8 != 0x1f) {
              uVar20 = s_Truths6[(int)uVar12];
              uVar18 = 0;
              do {
                bVar7 = (byte)(1 << (bVar6 & 0x1f));
                local_1b8.pTruth[uVar18] =
                     (local_1b8.pTruth[uVar18] & uVar20) >> (bVar7 & 0x3f) |
                     local_1b8.pTruth[uVar18] << (bVar7 & 0x3f) & uVar20;
                uVar18 = uVar18 + 1;
              } while (uVar15 != uVar18);
            }
          }
          else if (iVar8 != 0x1f) {
            bVar6 = (byte)(uVar12 - 6);
            uVar5 = 1 << (bVar6 & 0x1f);
            iVar14 = 2 << (bVar6 & 0x1f);
            uVar20 = 1;
            if (1 < (int)uVar5) {
              uVar20 = (ulong)uVar5;
            }
            puVar19 = local_1b8.pTruth + (int)uVar5;
            pwVar21 = local_1b8.pTruth;
            do {
              if (uVar12 - 6 != 0x1f) {
                uVar18 = 0;
                do {
                  uVar3 = pwVar21[uVar18];
                  pwVar21[uVar18] = puVar19[uVar18];
                  puVar19[uVar18] = uVar3;
                  uVar18 = uVar18 + 1;
                } while (uVar20 != uVar18);
              }
              pwVar21 = pwVar21 + iVar14;
              puVar19 = puVar19 + iVar14;
            } while (pwVar21 < local_1b8.pTruth + (int)uVar15);
          }
          uVar16 = uVar16 ^ 1 << (uVar12 & 0x1f);
          local_1b8.uPhase = uVar16;
        }
        bVar10 = local_1b8.symLink[bVar10];
      } while (-1 < (char)bVar10);
    }
    CheckConfig(&local_1b8);
    iVar8 = local_1b8.nVars;
    uVar20 = uVar13;
    do {
      if ((int)uVar20 < 1) goto LAB_004fdd65;
      lVar9 = uVar20 + 0x3ff;
      lVar4 = uVar20 + 0x3ff;
      uVar20 = uVar20 - 1;
    } while (Abc_TgSymGroupPerm::pCopy[lVar4] == Abc_TgPermEnumerationScc::pCopy[lVar9]);
    if (Abc_TgPermEnumerationScc::pCopy[lVar9] <= Abc_TgSymGroupPerm::pCopy[lVar4]) {
      memcpy(local_e4,&local_1b8.nGVars,0xb4);
      uVar16 = 1 << ((char)iVar8 - 6U & 0x1f);
      if (iVar8 < 7) {
        uVar16 = 1;
      }
      local_1f0 = 5;
      iVar1 = iVar8;
      if (0 < (int)uVar16) {
        lVar9 = 0;
        do {
          *(undefined8 *)((long)Abc_TgSymGroupPerm::pBest + lVar9) =
               *(undefined8 *)((long)local_1b8.pTruth + lVar9);
          lVar9 = lVar9 + 8;
        } while ((ulong)uVar16 << 3 != lVar9);
      }
    }
LAB_004fdd65:
    bVar10 = local_1b8.pPerm[(long)idx + 1];
    if (-1 < (char)bVar10) {
      iVar8 = local_1b8.nVars + -6;
      uVar15 = 1 << ((byte)iVar8 & 0x1f);
      uVar16 = local_1b8.uPhase;
      do {
        if (local_1b8.symPhase[bVar10] != '\0') {
          bVar6 = local_1b8.pPermTRev[bVar10];
          uVar12 = (uint)(char)bVar6;
          if (local_1b8.nVars < 7) {
            bVar6 = (byte)(1 << (bVar6 & 0x1f));
            *local_1b8.pTruth =
                 (s_Truths6[(int)uVar12] & *local_1b8.pTruth) >> (bVar6 & 0x3f) |
                 *local_1b8.pTruth << (bVar6 & 0x3f) & s_Truths6[(int)uVar12];
          }
          else if ((char)bVar6 < '\x06') {
            if (iVar8 != 0x1f) {
              uVar20 = s_Truths6[(int)uVar12];
              uVar18 = 0;
              do {
                bVar7 = (byte)(1 << (bVar6 & 0x1f));
                local_1b8.pTruth[uVar18] =
                     (local_1b8.pTruth[uVar18] & uVar20) >> (bVar7 & 0x3f) |
                     local_1b8.pTruth[uVar18] << (bVar7 & 0x3f) & uVar20;
                uVar18 = uVar18 + 1;
              } while (uVar15 != uVar18);
            }
          }
          else if (iVar8 != 0x1f) {
            bVar6 = (byte)(uVar12 - 6);
            uVar5 = 1 << (bVar6 & 0x1f);
            iVar14 = 2 << (bVar6 & 0x1f);
            uVar20 = 1;
            if (1 < (int)uVar5) {
              uVar20 = (ulong)uVar5;
            }
            puVar19 = local_1b8.pTruth + (int)uVar5;
            pwVar21 = local_1b8.pTruth;
            do {
              if (uVar12 - 6 != 0x1f) {
                uVar18 = 0;
                do {
                  uVar3 = pwVar21[uVar18];
                  pwVar21[uVar18] = puVar19[uVar18];
                  puVar19[uVar18] = uVar3;
                  uVar18 = uVar18 + 1;
                } while (uVar20 != uVar18);
              }
              pwVar21 = pwVar21 + iVar14;
              puVar19 = puVar19 + iVar14;
            } while (pwVar21 < local_1b8.pTruth + (int)uVar15);
          }
          uVar16 = uVar16 ^ 1 << (uVar12 & 0x1f);
          local_1b8.uPhase = uVar16;
        }
        bVar10 = local_1b8.symLink[bVar10];
      } while (-1 < (char)bVar10);
    }
    CheckConfig(&local_1b8);
    uVar20 = uVar13;
    do {
      if ((int)uVar20 < 1) goto LAB_004fdf55;
      lVar9 = uVar20 + 0x3ff;
      lVar4 = uVar20 + 0x3ff;
      uVar20 = uVar20 - 1;
    } while (Abc_TgSymGroupPerm::pCopy[lVar4] == Abc_TgPermEnumerationScc::pCopy[lVar9]);
    if (Abc_TgPermEnumerationScc::pCopy[lVar9] <= Abc_TgSymGroupPerm::pCopy[lVar4]) {
      memcpy(local_e4,&local_1b8.nGVars,0xb4);
      uVar16 = 1 << ((char)local_1b8.nVars - 6U & 0x1f);
      if (local_1b8.nVars < 7) {
        uVar16 = 1;
      }
      iVar1 = local_1b8.nVars;
      if ((int)uVar16 < 1) {
        local_1f0 = 4;
      }
      else {
        local_1f0 = 4;
        lVar9 = 0;
        do {
          *(undefined8 *)((long)Abc_TgSymGroupPerm::pBest + lVar9) =
               *(undefined8 *)((long)local_1b8.pTruth + lVar9);
          lVar9 = lVar9 + 8;
        } while ((ulong)uVar16 << 3 != lVar9);
      }
    }
LAB_004fdf55:
    Abc_TgSwapAdjacentSymGroups(&local_1b8,idx);
    CheckConfig(&local_1b8);
    pwVar21 = local_f8;
    if (0 < (int)uVar11) {
      lVar9 = 0;
      do {
        if (*(long *)((long)local_f8 + lVar9) != *(long *)((long)Abc_TgSymGroupPerm::pCopy + lVar9))
        {
          __assert_fail("Abc_TtEqual(pTruth, pCopy, nWords)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                        ,0x846,"int Abc_TgSymGroupPerm(Abc_TgMan_t *, int, int)");
        }
        lVar9 = lVar9 + 8;
      } while (uVar13 * 8 - lVar9 != 0);
    }
    if (local_1f0 == 0) {
      return 0;
    }
    do {
      if ((int)uVar13 < 1) goto LAB_004fe059;
      lVar9 = uVar13 + 0x3ff;
      lVar4 = uVar13 - 1;
      uVar13 = uVar13 - 1;
    } while (local_f8[lVar4] == Abc_TgSymGroupPerm::pCopy[lVar9]);
    if (local_f8[lVar4] < Abc_TgSymGroupPerm::pCopy[lVar9]) {
LAB_004fe059:
      __assert_fail("Abc_TtCompareRev(pTruth, pBest, nWords) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                    ,0x849,"int Abc_TgSymGroupPerm(Abc_TgMan_t *, int, int)");
    }
    pMan->pTruth = Abc_TgSymGroupPerm::pBest;
    pMan->nVars = iVar1;
    memcpy(local_f0,local_e4,0xb4);
    uVar11 = 1 << ((char)iVar1 - 6U & 0x1f);
    if (iVar1 < 7) {
      uVar11 = 1;
    }
    if (0 < (int)uVar11) {
      lVar9 = 0;
      do {
        *(undefined8 *)((long)pwVar21 + lVar9) =
             *(undefined8 *)((long)Abc_TgSymGroupPerm::pBest + lVar9);
        lVar9 = lVar9 + 8;
      } while ((ulong)uVar11 << 3 != lVar9);
    }
  }
  else {
    if (0 < (int)uVar16) {
      lVar9 = 0;
      do {
        *(undefined8 *)((long)Abc_TgSymGroupPerm::pCopy + lVar9) =
             *(undefined8 *)((long)pwVar21 + lVar9);
        lVar9 = lVar9 + 8;
      } while (uVar20 << 3 != lVar9);
    }
    local_1b8.pTruth = Abc_TgSymGroupPerm::pCopy;
    Abc_TgSwapAdjacentSymGroups(&local_1b8,idx);
    CheckConfig(&local_1b8);
    pwVar21 = local_f8;
    do {
      if ((int)uVar13 < 1) {
        return 0;
      }
      lVar9 = uVar13 + 0x3ff;
      lVar4 = uVar13 - 1;
      uVar13 = uVar13 - 1;
    } while (local_f8[lVar4] == Abc_TgPermEnumerationScc::pCopy[lVar9]);
    if (Abc_TgPermEnumerationScc::pCopy[lVar9] <= local_f8[lVar4]) {
      return 0;
    }
    memcpy(pMan,&local_1b8,0xc0);
    uVar11 = 1 << ((char)local_1b8.nVars - 6U & 0x1f);
    if (local_1b8.nVars < 7) {
      uVar11 = 1;
    }
    local_1f0 = 4;
    if (0 < (int)uVar11) {
      uVar13 = 0;
      do {
        pwVar21[uVar13] = local_1b8.pTruth[uVar13];
        uVar13 = uVar13 + 1;
      } while (uVar11 != uVar13);
    }
  }
  pMan->pTruth = pwVar21;
  return local_1f0;
}

Assistant:

static int Abc_TgSymGroupPerm(Abc_TgMan_t* pMan, int idx, int fSwapOnly)
{
    word* pTruth = pMan->pTruth;
    static word pCopy[1024];
    static word pBest[1024];
    int Config = 0;
    int nWords = Abc_TtWordNum(pMan->nVars);
    Abc_TgMan_t tgManCopy, tgManBest;

    CheckConfig(pMan);
    if (fSwapOnly)
    {
        Abc_TgManCopy(&tgManCopy, pCopy, pMan);
        Abc_TgSwapAdjacentSymGroups(&tgManCopy, idx);
        CheckConfig(&tgManCopy);
        if (Abc_TtCompareRev(pTruth, pCopy, nWords) < 0)
        {
            Abc_TgManCopy(pMan, pTruth, &tgManCopy);
            return 4;
        }
        return 0;
    }

    // save two copies
    Abc_TgManCopy(&tgManCopy, pCopy, pMan);
    Abc_TgManCopy(&tgManBest, pBest, pMan);
    // PXY
    // 001
    Abc_TgFlipSymGroup(&tgManCopy, idx);
    CheckConfig(&tgManCopy);
    if (Abc_TtCompareRev(pBest, pCopy, nWords) == 1)
        Abc_TgManCopy(&tgManBest, pBest, &tgManCopy), Config = 1;
    // PXY
    // 011
    Abc_TgFlipSymGroup(&tgManCopy, idx + 1);
    CheckConfig(&tgManCopy);
    if (Abc_TtCompareRev(pBest, pCopy, nWords) == 1)
        Abc_TgManCopy(&tgManBest, pBest, &tgManCopy), Config = 3;
    // PXY
    // 010
    Abc_TgFlipSymGroup(&tgManCopy, idx);
    CheckConfig(&tgManCopy);
    if (Abc_TtCompareRev(pBest, pCopy, nWords) == 1)
        Abc_TgManCopy(&tgManBest, pBest, &tgManCopy), Config = 2;
    // PXY
    // 110
    Abc_TgSwapAdjacentSymGroups(&tgManCopy, idx);
    CheckConfig(&tgManCopy);
    if (Abc_TtCompareRev(pBest, pCopy, nWords) == 1)
        Abc_TgManCopy(&tgManBest, pBest, &tgManCopy), Config = 6;
    // PXY
    // 111
    Abc_TgFlipSymGroup(&tgManCopy, idx + 1);
    CheckConfig(&tgManCopy);
    if (Abc_TtCompareRev(pBest, pCopy, nWords) == 1)
        Abc_TgManCopy(&tgManBest, pBest, &tgManCopy), Config = 7;
    // PXY
    // 101
    Abc_TgFlipSymGroup(&tgManCopy, idx);
    CheckConfig(&tgManCopy);
    if (Abc_TtCompareRev(pBest, pCopy, nWords) == 1)
        Abc_TgManCopy(&tgManBest, pBest, &tgManCopy), Config = 5;
    // PXY
    // 100
    Abc_TgFlipSymGroup(&tgManCopy, idx + 1);
    CheckConfig(&tgManCopy);
    if (Abc_TtCompareRev(pBest, pCopy, nWords) == 1)
        Abc_TgManCopy(&tgManBest, pBest, &tgManCopy), Config = 4;
    // PXY
    // 000
    Abc_TgSwapAdjacentSymGroups(&tgManCopy, idx);
    CheckConfig(&tgManCopy);
    assert(Abc_TtEqual(pTruth, pCopy, nWords));
    if (Config == 0)
        return 0;
    assert(Abc_TtCompareRev(pTruth, pBest, nWords) == 1);
    Abc_TgManCopy(pMan, pTruth, &tgManBest);
    return Config;
}